

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.h
# Opt level: O2

bool operator==(ExactFloat *a,ExactFloat *b)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = a->bn_exp_;
  bVar2 = false;
  if (((iVar1 != 0x7fffffff) && (bVar2 = false, iVar1 == b->bn_exp_)) &&
     (bVar2 = true, iVar1 != 0x7ffffffd)) {
    if (a->sign_ != b->sign_) {
      return false;
    }
    iVar1 = BN_ucmp((BIGNUM *)(a->bn_).bn_,(BIGNUM *)(b->bn_).bn_);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

inline bool ExactFloat::is_nan() const { return bn_exp_ == kExpNaN; }